

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

bool __thiscall
duckdb::BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>::
Flush<duckdb::BitpackingCompressionState<duckdb::hugeint_t,true,duckdb::hugeint_t>::BitpackingWriter>
          (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> *this)

{
  BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t> BVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  idx_t iVar5;
  int64_t extraout_RDX;
  int64_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t iVar6;
  hugeint_t value;
  hugeint_t value_00;
  hugeint_t value_01;
  hugeint_t frame_of_reference;
  void *in_stack_ffffffffffffffc0;
  
  if (*(long *)(this + 0x10818) == 0) {
    return true;
  }
  if (((this[0x108a1] != (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x0) ||
      (bVar2 = hugeint_t::operator==((hugeint_t *)(this + 0x10840),(hugeint_t *)(this + 0x10830)),
      bVar2)) && ((byte)((char)this[0x108a4] - 1U) < 2)) {
    BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteConstant(*(hugeint_t *)(this + 0x10840),*(idx_t *)(this + 0x10818),
                  *(void **)(this + 0x10828),(bool)this[0x108a1]);
    *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x14;
    return true;
  }
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::CalculateFORStats
            ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this);
  BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::CalculateDeltaStats
            ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this);
  iVar6 = extraout_RDX;
  if (this[0x108a2] == (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x1) {
    bVar2 = hugeint_t::operator==((hugeint_t *)(this + 0x10870),(hugeint_t *)(this + 0x10860));
    if ((bVar2) && (((byte)this[0x108a4] & 0xfe) != 4)) {
      BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteConstantDelta(*(hugeint_t *)(this + 0x10870),**(hugeint_t **)(this + 0x8010),
                         *(idx_t *)(this + 0x10818),*(hugeint_t **)(this + 0x8010),
                         (bool *)(this + 0x10018),*(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x24;
      return true;
    }
    value.upper = extraout_RDX_00;
    value.lower = *(uint64_t *)(this + 0x10888);
    bVar3 = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,false>
                      (*(BitpackingPrimitives **)(this + 0x10880),value);
    value_00.upper = extraout_RDX_01;
    value_00.lower = *(uint64_t *)(this + 0x10858);
    bVar4 = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,true>
                      (*(BitpackingPrimitives **)(this + 0x10850),value_00);
    iVar6 = extraout_RDX_02;
    if ((bVar3 < bVar4) &&
       (this[0x108a4] != (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x5)) {
      BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::
      SubtractFrameOfReference<duckdb::hugeint_t>
                ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this,
                 (hugeint_t *)(this + 0x8018),*(hugeint_t *)(this + 0x10860));
      BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
      WriteDeltaFor((hugeint_t *)(this + 0x8018),(bool *)(this + 0x10018),bVar3,
                    *(hugeint_t *)(this + 0x10860),*(hugeint_t *)(this + 0x10890),
                    *(hugeint_t **)(this + 0x8010),*(idx_t *)(this + 0x10818),
                    *(void **)(this + 0x10828));
      *(long *)(this + 0x10820) = *(long *)(this + 0x10820) + 0x28;
      iVar5 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x10818),bVar3);
      *(idx_t *)(this + 0x10820) = *(long *)(this + 0x10820) + iVar5;
      return true;
    }
  }
  BVar1 = this[0x108a3];
  if (BVar1 == (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x1) {
    value_01.upper = iVar6;
    value_01.lower = *(uint64_t *)(this + 0x10858);
    bVar3 = BitpackingPrimitives::MinimumBitWidth<duckdb::hugeint_t,false>
                      (*(BitpackingPrimitives **)(this + 0x10850),value_01);
    BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t>::
    SubtractFrameOfReference<duckdb::hugeint_t>
              ((BitpackingState<duckdb::hugeint_t,_duckdb::hugeint_t> *)this,
               *(hugeint_t **)(this + 0x8010),*(hugeint_t *)(this + 0x10830));
    frame_of_reference.upper = *(int64_t *)(this + 0x10818);
    frame_of_reference.lower = *(uint64_t *)(this + 0x10838);
    BitpackingCompressionState<duckdb::hugeint_t,_true,_duckdb::hugeint_t>::BitpackingWriter::
    WriteFor(*(BitpackingWriter **)(this + 0x8010),(hugeint_t *)(this + 0x10018),
             (bool *)(ulong)bVar3,(bitpacking_width_t)*(undefined8 *)(this + 0x10830),
             frame_of_reference,*(idx_t *)(this + 0x10828),in_stack_ffffffffffffffc0);
    iVar5 = BitpackingPrimitives::GetRequiredSize(*(idx_t *)(this + 0x10818),bVar3);
    *(idx_t *)(this + 0x10820) = iVar5 + *(long *)(this + 0x10820) + 0x18;
  }
  return BVar1 == (BitpackingState<duckdb::hugeint_t,duckdb::hugeint_t>)0x1;
}

Assistant:

bool Flush() {
		if (compression_buffer_idx == 0) {
			return true;
		}

		if ((all_invalid || maximum == minimum) && (mode == BitpackingMode::AUTO || mode == BitpackingMode::CONSTANT)) {
			OP::WriteConstant(maximum, compression_buffer_idx, data_ptr, all_invalid);
			total_size += sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
			return true;
		}

		CalculateFORStats();
		CalculateDeltaStats();

		if (can_do_delta) {
			if (maximum_delta == minimum_delta && mode != BitpackingMode::FOR && mode != BitpackingMode::DELTA_FOR) {
				// FOR needs to be T (considering hugeint is bigger than idx_t)
				T frame_of_reference = compression_buffer[0];

				OP::WriteConstantDelta(maximum_delta, static_cast<T>(frame_of_reference), compression_buffer_idx,
				                       compression_buffer, compression_buffer_validity, data_ptr);
				total_size += sizeof(T) + sizeof(T) + sizeof(bitpacking_metadata_encoded_t);
				return true;
			}

			// Check if delta has benefit
			auto delta_required_bitwidth =
			    BitpackingPrimitives::MinimumBitWidth<T, false>(static_cast<T>(min_max_delta_diff));
			auto regular_required_bitwidth = BitpackingPrimitives::MinimumBitWidth(min_max_diff);

			if (delta_required_bitwidth < regular_required_bitwidth && mode != BitpackingMode::FOR) {
				SubtractFrameOfReference(delta_buffer, minimum_delta);

				OP::WriteDeltaFor(reinterpret_cast<T *>(delta_buffer), compression_buffer_validity,
				                  delta_required_bitwidth, static_cast<T>(minimum_delta), delta_offset,
				                  compression_buffer, compression_buffer_idx, data_ptr);

				// FOR (frame of reference).
				total_size += sizeof(T);
				// Aligned bitpacking width.
				total_size += AlignValue(sizeof(bitpacking_width_t));
				// Delta offset.
				total_size += sizeof(T);
				// Compressed data size.
				total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, delta_required_bitwidth);

				return true;
			}
		}

		if (can_do_for) {
			auto width = BitpackingPrimitives::MinimumBitWidth<T, false>(min_max_diff);
			SubtractFrameOfReference(compression_buffer, minimum);
			OP::WriteFor(compression_buffer, compression_buffer_validity, width, minimum, compression_buffer_idx,
			             data_ptr);

			total_size += BitpackingPrimitives::GetRequiredSize(compression_buffer_idx, width);
			total_size += sizeof(T); // FOR value
			total_size += AlignValue(sizeof(bitpacking_width_t));

			return true;
		}

		return false;
	}